

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int ssl_update_checksum_sha256(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  
  iVar1 = mbedtls_md_update(&ssl->handshake->fin_sha256,buf,len);
  return iVar1;
}

Assistant:

static int ssl_update_checksum_sha256(mbedtls_ssl_context *ssl,
                                      const unsigned char *buf, size_t len)
{
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    return mbedtls_md_error_from_psa(psa_hash_update(
                                         &ssl->handshake->fin_sha256_psa, buf, len));
#else
    return mbedtls_md_update(&ssl->handshake->fin_sha256, buf, len);
#endif
}